

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryContextTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::QueryContextCase::executeForContext
          (QueryContextCase *this,EGLDisplay display,EGLContext context,EGLSurface surface,
          Config *config)

{
  bool bVar1;
  EGLint EVar2;
  EGLint EVar3;
  Library *egl_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_b08;
  MessageBuilder local_988;
  MessageBuilder local_808;
  MessageBuilder local_688;
  EGLint local_504;
  EGLint renderBuffer;
  MessageBuilder local_4f8;
  EGLint local_374;
  EGLint clientVersion;
  MessageBuilder local_368;
  EGLint local_1e8;
  EGLint clientType;
  MessageBuilder local_1d0;
  EGLint local_50;
  int local_4c;
  EGLint surfaceConfigID;
  EGLint configID;
  Version version;
  TestLog *log;
  Library *egl;
  Config *config_local;
  EGLSurface surface_local;
  EGLContext context_local;
  EGLDisplay display_local;
  QueryContextCase *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                      super_TestCase.m_eglTestCtx);
  version = (Version)tcu::TestContext::getLog
                               ((this->super_SingleContextRenderCase).super_RenderCase.
                                super_SimpleConfigCase.super_TestCase.super_TestCase.super_TestNode.
                                m_testCtx);
  _surfaceConfigID = eglu::getVersion(egl_00,display);
  eglu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
  local_4c = getContextAttrib(this,display,context,0x3028);
  local_50 = eglu::getConfigAttribInt(egl_00,display,config->config,0x3028);
  if (local_4c != local_50) {
    tcu::TestLog::operator<<
              (&local_1d0,(TestLog *)version,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1d0,
                        (char (*) [68])
                        "  Fail, config ID doesn\'t match the one used to create the context.");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    tcu::TestContext::setTestResult
              ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Invalid config ID");
  }
  eglu::Version::Version((Version *)&stack0xfffffffffffffe1c,1,2);
  bVar1 = eglu::Version::operator>=((Version *)&surfaceConfigID,(Version *)&stack0xfffffffffffffe1c)
  ;
  if (bVar1) {
    EVar2 = getContextAttrib(this,display,context,0x3097);
    local_1e8 = EVar2;
    EVar3 = getClientTypeFromAPIBit(config->apiBits);
    if (EVar2 != EVar3) {
      tcu::TestLog::operator<<
                (&local_368,(TestLog *)version,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_368,(char (*) [39])"  Fail, client API type doesn\'t match.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_368);
      tcu::TestContext::setTestResult
                ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                 super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid client API type");
    }
  }
  eglu::Version::Version((Version *)&stack0xfffffffffffffc90,1,3);
  bVar1 = eglu::Version::operator>=((Version *)&surfaceConfigID,(Version *)&stack0xfffffffffffffc90)
  ;
  if (bVar1) {
    EVar2 = getContextAttrib(this,display,context,0x3098);
    local_374 = EVar2;
    EVar3 = getMinClientMajorVersion(config->apiBits);
    if (EVar2 < EVar3) {
      tcu::TestLog::operator<<
                (&local_4f8,(TestLog *)version,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_4f8,(char (*) [42])"  Fail, client API version doesn\'t match.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4f8);
      tcu::TestContext::setTestResult
                ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                 super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid client API version");
    }
  }
  eglu::Version::Version((Version *)&stack0xfffffffffffffb00,1,2);
  bVar1 = eglu::Version::operator>=((Version *)&surfaceConfigID,(Version *)&stack0xfffffffffffffb00)
  ;
  if (bVar1) {
    local_504 = getContextAttrib(this,display,context,0x3086);
    if ((config->surfaceTypeBit == 2) && (local_504 != 0x3085)) {
      tcu::TestLog::operator<<
                (&local_688,(TestLog *)version,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_688,
                          (char (*) [72])
                          "  Fail, render buffer should be EGL_SINGLE_BUFFER for a pixmap surface.")
      ;
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_688);
      tcu::TestContext::setTestResult
                ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                 super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid render buffer");
    }
    else if ((config->surfaceTypeBit == 1) && (local_504 != 0x3084)) {
      tcu::TestLog::operator<<
                (&local_808,(TestLog *)version,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_808,
                          (char (*) [71])
                          "  Fail, render buffer should be EGL_BACK_BUFFER for a pbuffer surface.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_808);
      tcu::TestContext::setTestResult
                ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                 super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid render buffer");
    }
    else if (((config->surfaceTypeBit == 4) && (local_504 != 0x3085)) && (local_504 != 0x3084)) {
      tcu::TestLog::operator<<
                (&local_988,(TestLog *)version,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_988,
                          (char (*) [98])
                          "  Fail, render buffer should be either EGL_SINGLE_BUFFER or EGL_BACK_BUFFER for a window surface."
                         );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_988);
      tcu::TestContext::setTestResult
                ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                 super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid render buffer");
    }
  }
  eglu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
  tcu::TestLog::operator<<
            (&local_b08,(TestLog *)version,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_b08,(char (*) [7])"  Pass");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_b08);
  return;
}

Assistant:

void executeForContext (EGLDisplay display, EGLContext context, EGLSurface surface, const Config& config)
	{
		const Library&		egl		= m_eglTestCtx.getLibrary();
		TestLog&			log		= m_testCtx.getLog();
		const eglu::Version	version	= eglu::getVersion(egl, display);

		DE_UNREF(surface);
		enableLogging(true);

		// Config ID
		{
			const EGLint	configID		= getContextAttrib(display, context, EGL_CONFIG_ID);
			const EGLint	surfaceConfigID	= eglu::getConfigAttribInt(egl, display, config.config, EGL_CONFIG_ID);

			if (configID != surfaceConfigID)
			{
				log << TestLog::Message << "  Fail, config ID doesn't match the one used to create the context." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid config ID");
			}
		}

		// Client API type
		if (version >= eglu::Version(1, 2))
		{
			const EGLint	clientType		= getContextAttrib(display, context, EGL_CONTEXT_CLIENT_TYPE);

			if (clientType != getClientTypeFromAPIBit(config.apiBits))
			{
				log << TestLog::Message << "  Fail, client API type doesn't match." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid client API type");
			}
		}

		// Client API version
		if (version >= eglu::Version(1, 3))
		{
			const EGLint	clientVersion	= getContextAttrib(display, context, EGL_CONTEXT_CLIENT_VERSION);

			// \todo [2014-10-21 mika] Query actual supported api version from client api to make this check stricter.
			if (clientVersion < getMinClientMajorVersion(config.apiBits))
			{
				log << TestLog::Message << "  Fail, client API version doesn't match." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid client API version");
			}
		}

		// Render buffer
		if (version >= eglu::Version(1, 2))
		{
			const EGLint	renderBuffer	= getContextAttrib(display, context, EGL_RENDER_BUFFER);

			if (config.surfaceTypeBit == EGL_PIXMAP_BIT && renderBuffer != EGL_SINGLE_BUFFER)
			{
				log << TestLog::Message << "  Fail, render buffer should be EGL_SINGLE_BUFFER for a pixmap surface." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid render buffer");
			}
			else if (config.surfaceTypeBit == EGL_PBUFFER_BIT && renderBuffer != EGL_BACK_BUFFER)
			{
				log << TestLog::Message << "  Fail, render buffer should be EGL_BACK_BUFFER for a pbuffer surface." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid render buffer");
			}
			else if (config.surfaceTypeBit == EGL_WINDOW_BIT && renderBuffer != EGL_SINGLE_BUFFER && renderBuffer != EGL_BACK_BUFFER)
			{
				log << TestLog::Message << "  Fail, render buffer should be either EGL_SINGLE_BUFFER or EGL_BACK_BUFFER for a window surface." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid render buffer");
			}
		}

		enableLogging(false);

		log << TestLog::Message << "  Pass" << TestLog::EndMessage;
	}